

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  curl_hash *sh;
  int *__dest;
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  Curl_sh_entry *pCVar6;
  ulong uVar7;
  void *pvVar8;
  uint uVar9;
  int in_EDX;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int local_84;
  Curl_multi *local_80;
  curl_llist_element *local_78;
  curl_socket_t *local_70;
  curl_socket_t socks [5];
  int actions [5];
  
  for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
    socks[lVar5] = -1;
  }
  uVar3 = multi_getsock(data,socks,in_EDX);
  sh = &multi->sockhash;
  local_70 = data->sockets;
  __dest = data->actions;
  local_78 = &data->sh_queue;
  uVar7 = 0;
  local_80 = multi;
  do {
    uVar12 = (uint)uVar7;
    lVar5 = (long)(int)uVar12;
    if ((4 < (int)uVar12) || ((uVar3 >> ((byte)uVar7 & 0x1f) & 0x10001) == 0)) {
      lVar13 = 0;
      uVar14 = 0;
      if (0 < (int)uVar12) {
        uVar14 = uVar7;
      }
      do {
        if (data->numsocks <= lVar13) {
          memcpy(local_70,socks,lVar5 << 2);
          memcpy(__dest,actions,lVar5 << 2);
          data->numsocks = uVar12;
          return CURLM_OK;
        }
        iVar2 = local_70[lVar13];
        uVar7 = 0;
        do {
          if (uVar14 == uVar7) {
            pCVar6 = sh_getentry(sh,iVar2);
            if (pCVar6 != (Curl_sh_entry *)0x0) {
              uVar3 = __dest[lVar13];
              uVar11 = pCVar6->users - 1;
              pCVar6->users = uVar11;
              if ((uVar3 & 2) != 0) {
                pCVar6->writers = pCVar6->writers - 1;
              }
              if ((uVar3 & 1) != 0) {
                pCVar6->readers = pCVar6->readers - 1;
              }
              if (uVar11 == 0) {
                if (local_80->socket_cb != (curl_socket_callback)0x0) {
                  (*local_80->socket_cb)(data,iVar2,4,local_80->socket_userp,pCVar6->socketp);
                }
                sh_delentry(sh,iVar2);
              }
              else {
                Curl_llist_remove(&pCVar6->list,local_78,(void *)0x0);
              }
            }
            break;
          }
          piVar1 = socks + uVar7;
          uVar7 = uVar7 + 1;
        } while (iVar2 != *piVar1);
        lVar13 = lVar13 + 1;
      } while( true );
    }
    uVar10 = 1 << ((byte)(uVar12 + 0x10) & 0x1f);
    uVar4 = 1 << ((byte)uVar7 & 0x1f);
    iVar2 = socks[lVar5];
    pCVar6 = sh_getentry(sh,iVar2);
    uVar11 = (uint)((uVar3 >> (uVar12 & 0x1f) & 1) != 0);
    uVar9 = uVar11 + 2;
    if ((uVar3 >> (uVar12 + 0x10 & 0x1f) & 1) == 0) {
      uVar9 = uVar11;
    }
    actions[lVar5] = uVar9;
    if (pCVar6 == (Curl_sh_entry *)0x0) {
      local_84 = iVar2;
      pCVar6 = sh_getentry(sh,iVar2);
      if (pCVar6 == (Curl_sh_entry *)0x0) {
        pCVar6 = (Curl_sh_entry *)(*Curl_ccalloc)(1,0x40);
        if (pCVar6 == (Curl_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_llist_init((curl_llist *)pCVar6,(curl_llist_dtor)0x0);
        pvVar8 = Curl_hash_add(sh,&local_84,4,pCVar6);
        if (pvVar8 == (void *)0x0) {
          (*Curl_cfree)(pCVar6);
          return CURLM_OUT_OF_MEMORY;
        }
      }
    }
    else {
      uVar12 = data->numsocks;
      if (data->numsocks < 1) {
        uVar12 = 0;
      }
      for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
        if (iVar2 == data->sockets[uVar7]) {
          uVar12 = __dest[uVar7];
          if (uVar12 != uVar9) {
            if ((uVar12 & 1) != 0) {
              pCVar6->readers = pCVar6->readers - 1;
            }
            if ((uVar12 & 2) != 0) {
              pCVar6->writers = pCVar6->writers - 1;
            }
            if ((uVar4 & uVar3) != 0) {
              pCVar6->readers = pCVar6->readers + 1;
            }
            if ((uVar10 & uVar3) != 0) {
              pCVar6->writers = pCVar6->writers + 1;
            }
          }
          uVar12 = (uint)uVar7;
          goto LAB_0012822d;
        }
      }
    }
    pCVar6->users = pCVar6->users + 1;
    if ((uVar4 & uVar3) != 0) {
      pCVar6->readers = pCVar6->readers + 1;
    }
    if ((uVar10 & uVar3) != 0) {
      pCVar6->writers = pCVar6->writers + 1;
    }
    Curl_llist_insert_next(&pCVar6->list,(pCVar6->list).tail,data,local_78);
LAB_0012822d:
    uVar11 = (uint)(pCVar6->readers != 0) + (uint)(pCVar6->writers != 0) * 2;
    if (pCVar6->action != uVar11) {
      if (local_80->socket_cb != (curl_socket_callback)0x0) {
        (*local_80->socket_cb)(data,iVar2,uVar11,local_80->socket_userp,pCVar6->socketp);
      }
      pCVar6->action = uVar11;
    }
    uVar7 = (ulong)(uVar12 + 1);
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      for(i = 0; i< data->numsocks; i++) {
        if(s == data->sockets[i]) {
          prevaction = data->actions[i];
          sincebefore = TRUE;
          break;
        }
      }

    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the list of handles using this socket! */
      Curl_llist_insert_next(&entry->list, entry->list.tail,
                             data, &data->sh_queue);
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

#if 0
    infof(data, "--- Comboaction: %u readers %u writers\n",
          entry->readers, entry->writers);
#endif
    /* check if it has the same action set */
    if(entry->action == comboaction)
      /* same, continue */
      continue;

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       comboaction,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
      else {
        /* remove this transfer as a user of this socket */
        Curl_llist_remove(&entry->list, &data->sh_queue, NULL);
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}